

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  Mat cutm;
  Mat m;
  int q;
  int channels;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Mat *in_stack_ffffffffffffff80;
  int local_30;
  
  if (((*(int *)(in_RDI + 0x1c) - in_R8D) - in_R9D == *(int *)(in_RDI + 0x1c)) &&
     ((*(int *)(in_RDI + 0x20) - in_EDX) - in_ECX == *(int *)(in_RDI + 0x20))) {
    Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  else if (*(int *)(in_RDI + 0x18) == 2) {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (!bVar2) {
      copy_cut_border_image
                (in_stack_ffffffffffffff80,
                 (Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
    }
  }
  else if (*(int *)(in_RDI + 0x18) == 3) {
    iVar1 = *(int *)(in_RDI + 0x24);
    Mat::create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                in_stack_ffffffffffffff74,
                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (!bVar2) {
      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff64);
        Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff64);
        copy_cut_border_image
                  (in_stack_ffffffffffffff80,
                   (Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
        Mat::~Mat((Mat *)0x14f990);
        Mat::~Mat((Mat *)0x14f99a);
      }
    }
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    int w = src.w - left - right;
    int h = src.h - top - bottom;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        copy_cut_border_image(src, dst, top, left);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat cutm = dst.channel(q);

            copy_cut_border_image(m, cutm, top, left);
        }
    }
}